

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O1

StatementBlockSymbol *
slang::ast::StatementBlockSymbol::fromSyntax(Scope *scope,ForLoopStatementSyntax *syntax)

{
  Compilation *compilation;
  StatementSyntax *syntax_00;
  SourceLocation defaultLoc;
  StatementBlockSymbol *pSVar1;
  SyntaxNode *this;
  ForVariableDeclarationSyntax *syntax_01;
  VariableSymbol *lastVar;
  ulong uVar2;
  size_t index;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> sVar3;
  _Optional_payload_base<slang::ast::VariableLifetime> in_stack_ffffffffffffffa0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> local_48;
  
  defaultLoc = parsing::Token::location(&syntax->forKeyword);
  getLabel(&local_48,&syntax->super_StatementSyntax,defaultLoc);
  pSVar1 = createBlock((ast *)scope,(Scope *)syntax,(StatementSyntax *)local_48.first._M_len,
                       (string_view)local_48._8_16_,(SourceLocation)0x0,Sequential,
                       (optional<slang::ast::VariableLifetime>)in_stack_ffffffffffffffa0);
  uVar2 = (syntax->initializers).elements.size_ + 1;
  if (1 < uVar2) {
    compilation = scope->compilation;
    lastVar = (VariableSymbol *)0x0;
    index = 0;
    do {
      this = slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::operator[]
                       (&syntax->initializers,index);
      syntax_01 = slang::syntax::SyntaxNode::as<slang::syntax::ForVariableDeclarationSyntax>(this);
      lastVar = VariableSymbol::fromSyntax(compilation,syntax_01,lastVar);
      Scope::addMember(&pSVar1->super_Scope,(Symbol *)lastVar);
      index = index + 1;
    } while (uVar2 >> 1 != index);
  }
  syntax_00 = (syntax->statement).ptr;
  if (syntax_00 != (StatementSyntax *)0x0) {
    sVar3 = Statement::createAndAddBlockItems(&pSVar1->super_Scope,syntax_00,false);
    pSVar1->blocks = sVar3;
    return pSVar1;
  }
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,
             "T slang::not_null<slang::syntax::StatementSyntax *>::get() const [T = slang::syntax::StatementSyntax *]"
            );
}

Assistant:

StatementBlockSymbol& StatementBlockSymbol::fromSyntax(const Scope& scope,
                                                       const ForLoopStatementSyntax& syntax) {
    auto [name, loc] = getLabel(syntax, syntax.forKeyword.location());
    auto result = createBlock(scope, syntax, name, loc);

    // If one entry is a variable declaration, they must all be.
    // We'll only enter this function if we have variable decls.
    auto& comp = scope.getCompilation();
    const VariableSymbol* lastVar = nullptr;
    for (auto init : syntax.initializers) {
        auto& var = VariableSymbol::fromSyntax(comp, init->as<ForVariableDeclarationSyntax>(),
                                               lastVar);

        lastVar = &var;
        result->addMember(var);
    }

    result->blocks = Statement::createAndAddBlockItems(*result, *syntax.statement,
                                                       /* labelHandled */ false);
    return *result;
}